

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O1

RatioSequence * __thiscall
RatioSequence::getNonDesRSWithMinDist(RatioSequence *__return_storage_ptr__,RatioSequence *this)

{
  vector<Ratio,_std::allocator<Ratio>_> *this_00;
  int iVar1;
  pointer pRVar2;
  RatioSequence *pRVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  pointer pRVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  vector<int,_std::allocator<int>_> ccArray;
  Ratio combinedRatio;
  allocator_type local_a1;
  RatioSequence *local_a0;
  RatioSequence *local_98;
  double local_90;
  vector<int,_std::allocator<int>_> local_88;
  Ratio local_70;
  
  pRVar10 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar2 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a0 = __return_storage_ptr__;
  RatioSequence(__return_storage_ptr__,this);
  if (0x40 < (ulong)((long)pRVar10 - (long)pRVar2)) {
    local_70.eLength._0_4_ = 0;
    local_98 = this;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_88,
               (long)(this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 6,(value_type_conflict3 *)&local_70
               ,&local_a1);
    pRVar10 = (local_a0->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(local_a0->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pRVar10 != 0x40) {
      this_00 = &local_a0->_RatioSequence;
      iVar9 = 0;
      uVar8 = 0;
      do {
        local_90 = Ratio::getRatio(pRVar10 + uVar8);
        uVar7 = uVar8 + 1;
        dVar12 = Ratio::getRatio((this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>).
                                 _M_impl.super__Vector_impl_data._M_start + uVar7);
        if (local_90 <= dVar12) {
          uVar8 = (ulong)iVar9;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar8] = 0;
          uVar4 = ((long)(local_98->_RatioSequence).
                         super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(local_98->_RatioSequence).
                         super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6) - 1;
          if (uVar8 < uVar4) {
            do {
              if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8] == 2) break;
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar4);
            iVar9 = (int)uVar8;
          }
        }
        else {
          pRVar10 = (this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          Ratio::combine(&local_70,pRVar10 + uVar8,pRVar10 + uVar7);
          std::vector<Ratio,_std::allocator<Ratio>_>::_M_erase
                    (this_00,(this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                             super__Vector_impl_data._M_start + uVar8);
          std::vector<Ratio,_std::allocator<Ratio>_>::_M_erase
                    (this_00,(this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                             super__Vector_impl_data._M_start + uVar8);
          std::vector<Ratio,_std::allocator<Ratio>_>::insert
                    (this_00,(this_00->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                             super__Vector_impl_data._M_start + uVar8,&local_70);
          uVar4 = (ulong)iVar9;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] = 1;
          if (uVar8 == 0) {
            uVar6 = ((long)(local_98->_RatioSequence).
                           super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(local_98->_RatioSequence).
                           super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                           super__Vector_impl_data._M_start >> 6) - 1;
            uVar7 = uVar8;
            if (uVar4 < uVar6) {
              do {
                if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4] == 2) break;
                uVar4 = uVar4 + 1;
              } while (uVar4 < uVar6);
              iVar9 = (int)uVar4;
            }
          }
          else {
            iVar9 = iVar9 + 1;
            piVar5 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar4;
            do {
              iVar9 = iVar9 + -1;
              iVar1 = *piVar5;
              piVar5 = piVar5 + -1;
            } while (iVar1 == 1);
            uVar7 = uVar8 - 1;
          }
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70.fEdges);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70.eEdges);
        }
        pRVar10 = (local_a0->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar8 = uVar7;
      } while (uVar7 < ((long)(local_a0->_RatioSequence).
                              super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pRVar10 >> 6) - 1U);
    }
    pRVar3 = local_98;
    if ((long)(local_98->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(local_98->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
              super__Vector_impl_data._M_start == 0x40) {
      lVar11 = 0;
    }
    else {
      uVar8 = 0;
      lVar11 = 0;
      do {
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar8] == 1) {
          auVar13._8_4_ = (int)(uVar8 >> 0x20);
          auVar13._0_8_ = uVar8;
          auVar13._12_4_ = 0x45300000;
          dVar12 = exp2((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
          lVar11 = (long)((double)lVar11 + dVar12);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < ((long)(pRVar3->_RatioSequence).
                              super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pRVar3->_RatioSequence).
                              super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                              super__Vector_impl_data._M_start >> 6) - 1U);
    }
    local_a0->combineCode = lVar11;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return local_a0;
}

Assistant:

RatioSequence RatioSequence::getNonDesRSWithMinDist() {
    if (this->size() < 2) {
        return *this;
    }
    RatioSequence combinedRS(*this);
    size_t i = 0;   // index for stepping through rs
    long combineCode = 0;
    vector<int> ccArray(this->size(), 0);

    int a = 0; // array index

    while (i < combinedRS.size() - 1) {
        if (combinedRS[i].getRatio() > combinedRS[i + 1].getRatio()) {
            Ratio combinedRatio = Ratio::combine(combinedRS[i], combinedRS[i + 1]);
            combinedRS.erase(i);
            combinedRS.erase(i);
            combinedRS._RatioSequence.insert(combinedRS._RatioSequence.begin() + i, combinedRatio);
            ccArray[a] = 1;
            if (i > 0) {
                i--;
                // go back in the array to the last non-combined ratio
                while (ccArray[a] == 1) {
                    a--;
                }
            } else {
                // we must advance a
                while ((a < this->size() - 1) && (ccArray[a] != 2)) {
                    a++;
                }
            }
        } else {
            ccArray[a] = 0;
            // the ratios are not-descending, so go on to the next pair
            i++;
            // we must jump ahead to the next ratio not considered for combination
            while ((a < this->size() - 1) && (ccArray[a] != 2)) {
                a++;
            }
        }
    }

    for (size_t k = 0; k < this->size() - 1; k++) {
        if (ccArray[k] == 1) {
            combineCode += pow(2, k);
        }
    }
    combinedRS.setCombineCode(combineCode);

    return combinedRS;
}